

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::ClearImage::Implementation::Implementation
          (Implementation *this,OperationContext *context,Resource *resource,ClearMode mode)

{
  VkFormat format_00;
  deUint32 width;
  deUint32 height;
  deUint32 depth;
  ImageResource *pIVar1;
  VkDeviceSize __new_size;
  ImageResource *pIVar2;
  reference data;
  VkClearValue VVar3;
  undefined1 local_80 [8];
  PixelBufferAccess imagePixels;
  TextureFormat texFormat;
  VkFormat format;
  VkExtent3D *extent;
  VkDeviceSize size;
  ClearMode mode_local;
  Resource *resource_local;
  OperationContext *context_local;
  Implementation *this_local;
  
  Operation::Operation(&this->super_Operation);
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Implementation_01670030;
  this->m_context = context;
  this->m_resource = resource;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_data);
  pIVar1 = Resource::getImage(this->m_resource);
  VVar3 = makeClearValue(pIVar1->format);
  this->m_clearValue = VVar3;
  this->m_mode = mode;
  pIVar1 = Resource::getImage(this->m_resource);
  format_00 = pIVar1->format;
  pIVar1 = Resource::getImage(this->m_resource);
  __new_size = getPixelBufferSize(format_00,&pIVar1->extent);
  pIVar1 = Resource::getImage(this->m_resource);
  pIVar2 = Resource::getImage(this->m_resource);
  register0x00000000 = ::vk::mapVkFormat(pIVar2->format);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,__new_size);
  width = (pIVar1->extent).width;
  height = (pIVar1->extent).height;
  depth = (pIVar1->extent).depth;
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->m_data,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_80,
             (TextureFormat *)((long)&imagePixels.super_ConstPixelBufferAccess.m_data + 4),width,
             height,depth,data);
  clearPixelBuffer((PixelBufferAccess *)local_80,&this->m_clearValue);
  return;
}

Assistant:

Implementation (OperationContext& context, Resource& resource, const ClearMode mode)
		: m_context		(context)
		, m_resource	(resource)
		, m_clearValue	(makeClearValue(m_resource.getImage().format))
		, m_mode		(mode)
	{
		const VkDeviceSize			size		= getPixelBufferSize(m_resource.getImage().format, m_resource.getImage().extent);
		const VkExtent3D&			extent		= m_resource.getImage().extent;
		const VkFormat				format		= m_resource.getImage().format;
		const tcu::TextureFormat	texFormat	= mapVkFormat(format);

		m_data.resize(static_cast<std::size_t>(size));
		tcu::PixelBufferAccess imagePixels(texFormat, extent.width, extent.height, extent.depth, &m_data[0]);
		clearPixelBuffer(imagePixels, m_clearValue);
	}